

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::createAtomicOperation
          (TGlslangToSpvTraverser *this,TOperator op,Decoration param_2,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operands,TBasicType typeProxy,
          CoherentFlags *lvalueCoherentFlags,TType *opType)

{
  Id typeId_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  MemorySemanticsMask MVar4;
  MemorySemanticsMask MVar5;
  MemorySemanticsMask MVar6;
  uint uVar7;
  Id right;
  reference pvVar8;
  size_type sVar9;
  bool local_89;
  Id local_78;
  Id resultId;
  vector<unsigned_int,_std::allocator<unsigned_int>_> spvAtomicOperands;
  Id local_50;
  uint semanticsImmediate;
  Id semanticsId2;
  Id semanticsId;
  Id scopeId;
  Id valueId;
  Id compareId;
  Id pointerId;
  Op opCode;
  TBasicType typeProxy_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *operands_local;
  Decoration local_20;
  Id typeId_local;
  Decoration param_2_local;
  TOperator op_local;
  TGlslangToSpvTraverser *this_local;
  
  compareId = 0;
  pointerId = typeProxy;
  _opCode = operands;
  operands_local._4_4_ = typeId;
  local_20 = param_2;
  typeId_local = op;
  _param_2_local = this;
  switch(op) {
  case EOpAtomicAdd:
  case EOpAtomicCounterAdd:
  case EOpImageAtomicAdd:
    compareId = 0xea;
    if (((typeProxy == EbtFloat16) || (typeProxy == EbtFloat)) || (typeProxy == EbtDouble)) {
      compareId = 0x1793;
      if ((typeProxy == EbtFloat16) &&
         ((iVar2 = (*opType->_vptr_TType[0xc])(), iVar2 == 2 ||
          (iVar2 = (*opType->_vptr_TType[0xc])(), iVar2 == 4)))) {
        spv::Builder::addExtension(&this->builder,"SPV_NV_shader_atomic_fp16_vector");
        spv::Builder::addCapability(&this->builder,AtomicFloat16VectorNV);
      }
      else {
        spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_atomic_float_add");
        if (pointerId == 3) {
          spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_atomic_float16_add");
          spv::Builder::addCapability(&this->builder,AtomicFloat16AddEXT);
        }
        else if (pointerId == 1) {
          spv::Builder::addCapability(&this->builder,AtomicFloat32AddEXT);
        }
        else {
          spv::Builder::addCapability(&this->builder,AtomicFloat64AddEXT);
        }
      }
    }
    break;
  case EOpAtomicSubtract:
  case EOpAtomicCounterSubtract:
    compareId = 0xeb;
    break;
  case EOpAtomicMin:
  case EOpAtomicCounterMin:
  case EOpImageAtomicMin:
    if (((typeProxy == EbtFloat16) || (typeProxy == EbtFloat)) || (typeProxy == EbtDouble)) {
      compareId = 0x15ee;
      if ((typeProxy == EbtFloat16) &&
         ((iVar2 = (*opType->_vptr_TType[0xc])(), iVar2 == 2 ||
          (iVar2 = (*opType->_vptr_TType[0xc])(), iVar2 == 4)))) {
        spv::Builder::addExtension(&this->builder,"SPV_NV_shader_atomic_fp16_vector");
        spv::Builder::addCapability(&this->builder,AtomicFloat16VectorNV);
      }
      else {
        spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_atomic_float_min_max");
        if (pointerId == 3) {
          spv::Builder::addCapability(&this->builder,AtomicFloat16MinMaxEXT);
        }
        else if (pointerId == 1) {
          spv::Builder::addCapability(&this->builder,AtomicFloat32MinMaxEXT);
        }
        else {
          spv::Builder::addCapability(&this->builder,AtomicFloat64MinMaxEXT);
        }
      }
    }
    else if ((typeProxy == EbtUint) || (typeProxy == EbtUint64)) {
      compareId = 0xed;
    }
    else {
      compareId = 0xec;
    }
    break;
  case EOpAtomicMax:
  case EOpAtomicCounterMax:
  case EOpImageAtomicMax:
    if (((typeProxy == EbtFloat16) || (typeProxy == EbtFloat)) || (typeProxy == EbtDouble)) {
      compareId = 0x15ef;
      if ((typeProxy == EbtFloat16) &&
         ((iVar2 = (*opType->_vptr_TType[0xc])(), iVar2 == 2 ||
          (iVar2 = (*opType->_vptr_TType[0xc])(), iVar2 == 4)))) {
        spv::Builder::addExtension(&this->builder,"SPV_NV_shader_atomic_fp16_vector");
        spv::Builder::addCapability(&this->builder,AtomicFloat16VectorNV);
      }
      else {
        spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_atomic_float_min_max");
        if (pointerId == 3) {
          spv::Builder::addCapability(&this->builder,AtomicFloat16MinMaxEXT);
        }
        else if (pointerId == 1) {
          spv::Builder::addCapability(&this->builder,AtomicFloat32MinMaxEXT);
        }
        else {
          spv::Builder::addCapability(&this->builder,AtomicFloat64MinMaxEXT);
        }
      }
    }
    else if ((typeProxy == EbtUint) || (typeProxy == EbtUint64)) {
      compareId = 0xef;
    }
    else {
      compareId = 0xee;
    }
    break;
  case EOpAtomicAnd:
  case EOpAtomicCounterAnd:
  case EOpImageAtomicAnd:
    compareId = 0xf0;
    break;
  case EOpAtomicOr:
  case EOpAtomicCounterOr:
  case EOpImageAtomicOr:
    compareId = 0xf1;
    break;
  case EOpAtomicXor:
  case EOpAtomicCounterXor:
  case EOpImageAtomicXor:
    compareId = 0xf2;
    break;
  case EOpAtomicExchange:
  case EOpAtomicCounterExchange:
  case EOpImageAtomicExchange:
    if ((typeProxy == EbtFloat16) &&
       ((iVar2 = (*opType->_vptr_TType[0xc])(), iVar2 == 2 ||
        (iVar2 = (*opType->_vptr_TType[0xc])(), iVar2 == 4)))) {
      spv::Builder::addExtension(&this->builder,"SPV_NV_shader_atomic_fp16_vector");
      spv::Builder::addCapability(&this->builder,AtomicFloat16VectorNV);
    }
    compareId = 0xe5;
    break;
  case EOpAtomicCompSwap:
  case EOpAtomicCounterCompSwap:
  case EOpImageAtomicCompSwap:
    compareId = 0xe6;
    break;
  case EOpAtomicLoad:
  case EOpAtomicCounter:
  case EOpImageAtomicLoad:
    compareId = 0xe3;
    break;
  case EOpAtomicStore:
  case EOpImageAtomicStore:
    compareId = 0xe4;
    break;
  case EOpAtomicCounterIncrement:
    compareId = 0xe8;
    break;
  case EOpAtomicCounterDecrement:
    compareId = 0xe9;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x20a1,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createAtomicOperation(glslang::TOperator, spv::Decoration, spv::Id, std::vector<spv::Id> &, glslang::TBasicType, const spv::Builder::AccessChain::CoherentFlags &, const glslang::TType &)"
                 );
  }
  if ((pointerId == 10) || (pointerId == 0xb)) {
    spv::Builder::addCapability(&this->builder,CapabilityInt64Atomics);
  }
  valueId = 0;
  scopeId = 0;
  semanticsId = 0;
  bVar1 = glslang::TIntermediate::usingVulkanMemoryModel(this->glslangIntermediate);
  if (bVar1) {
    semanticsId2 = spv::Builder::makeUintConstant(&this->builder,5,false);
  }
  else {
    semanticsId2 = spv::Builder::makeUintConstant(&this->builder,1,false);
  }
  bVar1 = spv::Builder::AccessChain::CoherentFlags::isVolatile(lvalueCoherentFlags);
  local_89 = false;
  if (bVar1) {
    local_89 = glslang::TIntermediate::usingVulkanMemoryModel(this->glslangIntermediate);
  }
  uVar7 = 0;
  if (local_89 != false) {
    uVar7 = 0x8000;
  }
  local_50 = spv::Builder::makeUintConstant(&this->builder,uVar7,false);
  semanticsImmediate = local_50;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_opCode,0);
  valueId = *pvVar8;
  if ((compareId != 0xe8) && (compareId != 0xe9)) {
    if (compareId == 0xe6) {
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_opCode,1);
      scopeId = *pvVar8;
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_opCode,2);
      semanticsId = *pvVar8;
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_opCode);
      if (3 < sVar9) {
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_opCode,3);
        semanticsId2 = *pvVar8;
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_opCode,4);
        uVar7 = spv::Builder::getConstantScalar(&this->builder,*pvVar8);
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_opCode,5);
        uVar3 = spv::Builder::getConstantScalar(&this->builder,*pvVar8);
        semanticsImmediate = spv::Builder::makeUintConstant(&this->builder,uVar7 | uVar3,false);
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_opCode,6);
        uVar7 = spv::Builder::getConstantScalar(&this->builder,*pvVar8);
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_opCode,7);
        uVar3 = spv::Builder::getConstantScalar(&this->builder,*pvVar8);
        local_50 = spv::Builder::makeUintConstant(&this->builder,uVar7 | uVar3,false);
      }
    }
    else if (compareId == 0xe3) {
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_opCode);
      if (1 < sVar9) {
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_opCode,1);
        semanticsId2 = *pvVar8;
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_opCode,2);
        uVar7 = spv::Builder::getConstantScalar(&this->builder,*pvVar8);
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_opCode,3);
        uVar3 = spv::Builder::getConstantScalar(&this->builder,*pvVar8);
        semanticsImmediate = spv::Builder::makeUintConstant(&this->builder,uVar7 | uVar3,false);
      }
    }
    else {
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_opCode,1);
      semanticsId = *pvVar8;
      sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_opCode);
      if (2 < sVar9) {
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_opCode,2);
        semanticsId2 = *pvVar8;
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_opCode,3);
        uVar7 = spv::Builder::getConstantScalar(&this->builder,*pvVar8);
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_opCode,4);
        uVar3 = spv::Builder::getConstantScalar(&this->builder,*pvVar8);
        semanticsImmediate = spv::Builder::makeUintConstant(&this->builder,uVar7 | uVar3,false);
      }
    }
  }
  MVar4 = spv::Builder::getConstantScalar(&this->builder,semanticsImmediate);
  MVar5 = spv::Builder::getConstantScalar(&this->builder,local_50);
  spvAtomicOperands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = MVar4 | MVar5;
  MVar6 = spv::operator|(MakeAvailable,MakeVisible);
  MVar6 = spv::operator|(MVar6,MemorySemanticsOutputMemoryKHRMask);
  MVar6 = spv::operator|(MVar6,MemorySemanticsVolatileMask);
  if (((MVar4 | MVar5) & MVar6) != MaskNone) {
    spv::Builder::addCapability(&this->builder,CapabilityVulkanMemoryModel);
  }
  uVar7 = spv::Builder::getConstantScalar(&this->builder,semanticsId2);
  if (uVar7 == 5) {
    spv::Builder::addCapability(&this->builder,CapabilityVulkanMemoryModel);
  }
  bVar1 = glslang::TIntermediate::usingVulkanMemoryModel(this->glslangIntermediate);
  if ((bVar1) && (uVar7 = spv::Builder::getConstantScalar(&this->builder,semanticsId2), uVar7 == 1))
  {
    spv::Builder::addCapability(&this->builder,CapabilityVulkanMemoryModelDeviceScope);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&resultId);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&resultId,6);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&resultId,&valueId);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&resultId,&semanticsId2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&resultId,&semanticsImmediate);
  if (compareId == 0xe6) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&resultId,&local_50);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&resultId,&semanticsId);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&resultId,&scopeId);
  }
  else if (((compareId != 0xe3) && (compareId != 0xe8)) && (compareId != 0xe9)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&resultId,&semanticsId);
  }
  if (compareId == 0xe4) {
    spv::Builder::createNoResultOp
              (&this->builder,OpAtomicStore,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&resultId);
    this_local._4_4_ = 0;
  }
  else {
    local_78 = spv::Builder::createOp
                         (&this->builder,compareId,operands_local._4_4_,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&resultId);
    typeId_00 = operands_local._4_4_;
    if (typeId_local == 0x139) {
      right = spv::Builder::makeIntConstant(&this->builder,1,false);
      local_78 = spv::Builder::createBinOp(&this->builder,OpISub,typeId_00,local_78,right);
    }
    this_local._4_4_ = local_78;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&resultId);
  return this_local._4_4_;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createAtomicOperation(glslang::TOperator op, spv::Decoration /*precision*/,
    spv::Id typeId, std::vector<spv::Id>& operands, glslang::TBasicType typeProxy,
    const spv::Builder::AccessChain::CoherentFlags &lvalueCoherentFlags, const glslang::TType &opType)
{
    spv::Op opCode = spv::OpNop;

    switch (op) {
    case glslang::EOpAtomicAdd:
    case glslang::EOpImageAtomicAdd:
    case glslang::EOpAtomicCounterAdd:
        opCode = spv::OpAtomicIAdd;
        if (typeProxy == glslang::EbtFloat16 || typeProxy == glslang::EbtFloat || typeProxy == glslang::EbtDouble) {
            opCode = spv::OpAtomicFAddEXT;
            if (typeProxy == glslang::EbtFloat16 &&
                (opType.getVectorSize() == 2 || opType.getVectorSize() == 4)) {
                builder.addExtension(spv::E_SPV_NV_shader_atomic_fp16_vector);
                builder.addCapability(spv::CapabilityAtomicFloat16VectorNV);
            } else {
                builder.addExtension(spv::E_SPV_EXT_shader_atomic_float_add);
                if (typeProxy == glslang::EbtFloat16) {
                    builder.addExtension(spv::E_SPV_EXT_shader_atomic_float16_add);
                    builder.addCapability(spv::CapabilityAtomicFloat16AddEXT);
                } else if (typeProxy == glslang::EbtFloat) {
                    builder.addCapability(spv::CapabilityAtomicFloat32AddEXT);
                } else {
                    builder.addCapability(spv::CapabilityAtomicFloat64AddEXT);
                }
            }
        }
        break;
    case glslang::EOpAtomicSubtract:
    case glslang::EOpAtomicCounterSubtract:
        opCode = spv::OpAtomicISub;
        break;
    case glslang::EOpAtomicMin:
    case glslang::EOpImageAtomicMin:
    case glslang::EOpAtomicCounterMin:
        if (typeProxy == glslang::EbtFloat16 || typeProxy == glslang::EbtFloat || typeProxy == glslang::EbtDouble) {
            opCode = spv::OpAtomicFMinEXT;
            if (typeProxy == glslang::EbtFloat16 &&
                (opType.getVectorSize() == 2 || opType.getVectorSize() == 4)) {
                builder.addExtension(spv::E_SPV_NV_shader_atomic_fp16_vector);
                builder.addCapability(spv::CapabilityAtomicFloat16VectorNV);
            } else {
                builder.addExtension(spv::E_SPV_EXT_shader_atomic_float_min_max);
                if (typeProxy == glslang::EbtFloat16)
                    builder.addCapability(spv::CapabilityAtomicFloat16MinMaxEXT);
                else if (typeProxy == glslang::EbtFloat)
                    builder.addCapability(spv::CapabilityAtomicFloat32MinMaxEXT);
                else
                    builder.addCapability(spv::CapabilityAtomicFloat64MinMaxEXT);
            }
        } else if (typeProxy == glslang::EbtUint || typeProxy == glslang::EbtUint64) {
            opCode = spv::OpAtomicUMin;
        } else {
            opCode = spv::OpAtomicSMin;
        }
        break;
    case glslang::EOpAtomicMax:
    case glslang::EOpImageAtomicMax:
    case glslang::EOpAtomicCounterMax:
        if (typeProxy == glslang::EbtFloat16 || typeProxy == glslang::EbtFloat || typeProxy == glslang::EbtDouble) {
            opCode = spv::OpAtomicFMaxEXT;
            if (typeProxy == glslang::EbtFloat16 &&
                (opType.getVectorSize() == 2 || opType.getVectorSize() == 4)) {
                builder.addExtension(spv::E_SPV_NV_shader_atomic_fp16_vector);
                builder.addCapability(spv::CapabilityAtomicFloat16VectorNV);
            } else {
                builder.addExtension(spv::E_SPV_EXT_shader_atomic_float_min_max);
                if (typeProxy == glslang::EbtFloat16)
                    builder.addCapability(spv::CapabilityAtomicFloat16MinMaxEXT);
                else if (typeProxy == glslang::EbtFloat)
                    builder.addCapability(spv::CapabilityAtomicFloat32MinMaxEXT);
                else
                    builder.addCapability(spv::CapabilityAtomicFloat64MinMaxEXT);
            }
        } else if (typeProxy == glslang::EbtUint || typeProxy == glslang::EbtUint64) {
            opCode = spv::OpAtomicUMax;
        } else {
            opCode = spv::OpAtomicSMax;
        }
        break;
    case glslang::EOpAtomicAnd:
    case glslang::EOpImageAtomicAnd:
    case glslang::EOpAtomicCounterAnd:
        opCode = spv::OpAtomicAnd;
        break;
    case glslang::EOpAtomicOr:
    case glslang::EOpImageAtomicOr:
    case glslang::EOpAtomicCounterOr:
        opCode = spv::OpAtomicOr;
        break;
    case glslang::EOpAtomicXor:
    case glslang::EOpImageAtomicXor:
    case glslang::EOpAtomicCounterXor:
        opCode = spv::OpAtomicXor;
        break;
    case glslang::EOpAtomicExchange:
    case glslang::EOpImageAtomicExchange:
    case glslang::EOpAtomicCounterExchange:
        if ((typeProxy == glslang::EbtFloat16) && 
            (opType.getVectorSize() == 2 || opType.getVectorSize() == 4)) {
                builder.addExtension(spv::E_SPV_NV_shader_atomic_fp16_vector);
                builder.addCapability(spv::CapabilityAtomicFloat16VectorNV);
        }

        opCode = spv::OpAtomicExchange;
        break;
    case glslang::EOpAtomicCompSwap:
    case glslang::EOpImageAtomicCompSwap:
    case glslang::EOpAtomicCounterCompSwap:
        opCode = spv::OpAtomicCompareExchange;
        break;
    case glslang::EOpAtomicCounterIncrement:
        opCode = spv::OpAtomicIIncrement;
        break;
    case glslang::EOpAtomicCounterDecrement:
        opCode = spv::OpAtomicIDecrement;
        break;
    case glslang::EOpAtomicCounter:
    case glslang::EOpImageAtomicLoad:
    case glslang::EOpAtomicLoad:
        opCode = spv::OpAtomicLoad;
        break;
    case glslang::EOpAtomicStore:
    case glslang::EOpImageAtomicStore:
        opCode = spv::OpAtomicStore;
        break;
    default:
        assert(0);
        break;
    }

    if (typeProxy == glslang::EbtInt64 || typeProxy == glslang::EbtUint64)
        builder.addCapability(spv::CapabilityInt64Atomics);

    // Sort out the operands
    //  - mapping from glslang -> SPV
    //  - there are extra SPV operands that are optional in glslang
    //  - compare-exchange swaps the value and comparator
    //  - compare-exchange has an extra memory semantics
    //  - EOpAtomicCounterDecrement needs a post decrement
    spv::Id pointerId = 0, compareId = 0, valueId = 0;
    // scope defaults to Device in the old model, QueueFamilyKHR in the new model
    spv::Id scopeId;
    if (glslangIntermediate->usingVulkanMemoryModel()) {
        scopeId = builder.makeUintConstant(spv::ScopeQueueFamilyKHR);
    } else {
        scopeId = builder.makeUintConstant(spv::ScopeDevice);
    }
    // semantics default to relaxed
    spv::Id semanticsId = builder.makeUintConstant(lvalueCoherentFlags.isVolatile() &&
        glslangIntermediate->usingVulkanMemoryModel() ?
                                                    spv::MemorySemanticsVolatileMask :
                                                    spv::MemorySemanticsMaskNone);
    spv::Id semanticsId2 = semanticsId;

    pointerId = operands[0];
    if (opCode == spv::OpAtomicIIncrement || opCode == spv::OpAtomicIDecrement) {
        // no additional operands
    } else if (opCode == spv::OpAtomicCompareExchange) {
        compareId = operands[1];
        valueId = operands[2];
        if (operands.size() > 3) {
            scopeId = operands[3];
            semanticsId = builder.makeUintConstant(
                builder.getConstantScalar(operands[4]) | builder.getConstantScalar(operands[5]));
            semanticsId2 = builder.makeUintConstant(
                builder.getConstantScalar(operands[6]) | builder.getConstantScalar(operands[7]));
        }
    } else if (opCode == spv::OpAtomicLoad) {
        if (operands.size() > 1) {
            scopeId = operands[1];
            semanticsId = builder.makeUintConstant(
                builder.getConstantScalar(operands[2]) | builder.getConstantScalar(operands[3]));
        }
    } else {
        // atomic store or RMW
        valueId = operands[1];
        if (operands.size() > 2) {
            scopeId = operands[2];
            semanticsId = builder.makeUintConstant
                (builder.getConstantScalar(operands[3]) | builder.getConstantScalar(operands[4]));
        }
    }

    // Check for capabilities
    unsigned semanticsImmediate = builder.getConstantScalar(semanticsId) | builder.getConstantScalar(semanticsId2);
    if (semanticsImmediate & (spv::MemorySemanticsMakeAvailableKHRMask |
                              spv::MemorySemanticsMakeVisibleKHRMask |
                              spv::MemorySemanticsOutputMemoryKHRMask |
                              spv::MemorySemanticsVolatileMask)) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelKHR);
    }

    if (builder.getConstantScalar(scopeId) == spv::ScopeQueueFamily) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelKHR);
    }

    if (glslangIntermediate->usingVulkanMemoryModel() && builder.getConstantScalar(scopeId) == spv::ScopeDevice) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelDeviceScopeKHR);
    }

    std::vector<spv::Id> spvAtomicOperands;  // hold the spv operands
    spvAtomicOperands.reserve(6);
    spvAtomicOperands.push_back(pointerId);
    spvAtomicOperands.push_back(scopeId);
    spvAtomicOperands.push_back(semanticsId);
    if (opCode == spv::OpAtomicCompareExchange) {
        spvAtomicOperands.push_back(semanticsId2);
        spvAtomicOperands.push_back(valueId);
        spvAtomicOperands.push_back(compareId);
    } else if (opCode != spv::OpAtomicLoad && opCode != spv::OpAtomicIIncrement && opCode != spv::OpAtomicIDecrement) {
        spvAtomicOperands.push_back(valueId);
    }

    if (opCode == spv::OpAtomicStore) {
        builder.createNoResultOp(opCode, spvAtomicOperands);
        return 0;
    } else {
        spv::Id resultId = builder.createOp(opCode, typeId, spvAtomicOperands);

        // GLSL and HLSL atomic-counter decrement return post-decrement value,
        // while SPIR-V returns pre-decrement value. Translate between these semantics.
        if (op == glslang::EOpAtomicCounterDecrement)
            resultId = builder.createBinOp(spv::OpISub, typeId, resultId, builder.makeIntConstant(1));

        return resultId;
    }
}